

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.cpp
# Opt level: O1

int __thiscall MovDemuxer::mov_read_mdat(MovDemuxer *this,MOVAtom atom)

{
  if (atom.size != 0) {
    if (this->m_mdat_pos == 0) {
      this->m_mdat_pos = (this->super_IOContextDemuxer).m_processedBytes;
      this->m_mdat_size = atom.size;
    }
    std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::
    emplace_back<long&,long&>
              ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)
               &this->m_mdat_data,&(this->super_IOContextDemuxer).m_processedBytes,&atom.size);
  }
  return 0;
}

Assistant:

int MovDemuxer::mov_read_mdat(MOVAtom atom)
{
    if (atom.size == 0)  // wrong one (MP4)
        return 0;
    if (m_mdat_pos == 0)
    {
        m_mdat_pos = m_processedBytes;
        m_mdat_size = atom.size;
    }
    m_mdat_data.emplace_back(m_processedBytes, atom.size);
    return 0;  // now go for moov
}